

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint unfilter(uchar *out,uchar *in,uint w,uint h,uint bpp)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  undefined4 uVar11;
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  uchar *puVar20;
  uchar *puVar21;
  ulong uVar22;
  uchar *puVar23;
  uchar *puVar24;
  size_t j;
  long lVar25;
  uchar *puVar26;
  ulong uVar27;
  long local_90;
  uchar *local_78;
  uchar *local_70;
  
  uVar16 = bpp + 7;
  uVar22 = (ulong)(uVar16 >> 3);
  uVar27 = (ulong)(w * bpp + 7 >> 3);
  lVar1 = uVar27 + 1;
  puVar21 = in + 1;
  local_78 = in + 3;
  lVar18 = -uVar22;
  local_90 = (long)out - uVar22;
  local_70 = in + 4;
  puVar23 = out + uVar22;
  puVar20 = in + uVar22 + 1;
  puVar26 = (uchar *)0x0;
  puVar24 = out;
  for (uVar19 = 0; uVar19 != h; uVar19 = uVar19 + 1) {
    switch(in[lVar1 * uVar19]) {
    case '\0':
      for (uVar17 = 0; uVar27 != uVar17; uVar17 = uVar17 + 1) {
        puVar24[uVar17] = puVar21[uVar17];
      }
      break;
    case '\x01':
      for (uVar17 = 0; uVar22 != uVar17; uVar17 = uVar17 + 1) {
        puVar24[uVar17] = puVar21[uVar17];
      }
      for (lVar25 = 0; uVar22 + lVar25 < uVar27; lVar25 = lVar25 + 1) {
        puVar23[lVar25] = puVar24[lVar25] + puVar20[lVar25];
      }
      break;
    case '\x02':
      uVar17 = 0;
      if (puVar26 == (uchar *)0x0) {
        for (; uVar27 != uVar17; uVar17 = uVar17 + 1) {
          puVar24[uVar17] = puVar21[uVar17];
        }
      }
      else {
        for (; uVar27 != uVar17; uVar17 = uVar17 + 1) {
          puVar24[uVar17] = puVar26[uVar17] + puVar21[uVar17];
        }
      }
      break;
    case '\x03':
      uVar17 = 0;
      if (puVar26 == (uchar *)0x0) {
        for (; uVar22 != uVar17; uVar17 = uVar17 + 1) {
          puVar24[uVar17] = puVar21[uVar17];
        }
        for (lVar25 = 0; uVar22 + lVar25 < uVar27; lVar25 = lVar25 + 1) {
          puVar23[lVar25] = (puVar24[lVar25] >> 1) + puVar20[lVar25];
        }
      }
      else {
        for (; uVar22 != uVar17; uVar17 = uVar17 + 1) {
          puVar24[uVar17] = (puVar26[uVar17] >> 1) + puVar21[uVar17];
        }
        for (lVar25 = 0; uVar22 + lVar25 < uVar27; lVar25 = lVar25 + 1) {
          puVar23[lVar25] =
               (char)((uint)puVar26[lVar25 + uVar22] + (uint)puVar24[lVar25] >> 1) + puVar20[lVar25]
          ;
        }
      }
      break;
    case '\x04':
      uVar17 = 0;
      if (puVar26 == (uchar *)0x0) {
        for (; uVar22 != uVar17; uVar17 = uVar17 + 1) {
          puVar24[uVar17] = puVar21[uVar17];
        }
        for (lVar25 = 0; uVar22 + lVar25 < uVar27; lVar25 = lVar25 + 1) {
          puVar23[lVar25] = puVar24[lVar25] + puVar20[lVar25];
        }
      }
      else {
        for (; uVar22 != uVar17; uVar17 = uVar17 + 1) {
          puVar24[uVar17] = puVar26[uVar17] + puVar21[uVar17];
        }
        if (uVar16 < 0x20) {
          if (uVar16 >> 3 == 3) {
            for (uVar17 = 3; uVar17 + 2 < uVar27; uVar17 = uVar17 + 3) {
              uVar12 = local_70[uVar17 - 3];
              uVar13 = local_70[uVar17 - 2];
              uVar14 = local_70[uVar17 - 1];
              bVar2 = puVar24[uVar17 - 2];
              bVar3 = puVar24[uVar17 - 1];
              bVar4 = puVar26[uVar17 + 1];
              bVar5 = puVar26[uVar17 + 2];
              bVar6 = puVar26[uVar17 - 2];
              bVar7 = puVar26[uVar17 - 1];
              uVar15 = paethPredictor((ushort)puVar24[uVar17 - 3],(ushort)puVar26[uVar17],
                                      (ushort)puVar26[uVar17 - 3]);
              puVar24[uVar17] = uVar15 + uVar12;
              uVar12 = paethPredictor((ushort)bVar2,(ushort)bVar4,(ushort)bVar6);
              puVar24[uVar17 + 1] = uVar12 + uVar13;
              uVar12 = paethPredictor((ushort)bVar3,(ushort)bVar5,(ushort)bVar7);
              puVar24[uVar17 + 2] = uVar12 + uVar14;
            }
          }
          else {
            uVar17 = uVar22;
            if (0xf < uVar16) {
              for (uVar17 = 2; uVar17 + 1 < uVar27; uVar17 = uVar17 + 2) {
                uVar12 = local_78[uVar17 - 2];
                uVar13 = local_78[uVar17 - 1];
                bVar2 = *(byte *)(local_90 + 1 + uVar17);
                bVar3 = puVar26[uVar17 + 1];
                bVar4 = puVar26[uVar17 + lVar18 + 1];
                uVar14 = paethPredictor((ushort)*(byte *)(local_90 + uVar17),(ushort)puVar26[uVar17]
                                        ,(ushort)puVar26[uVar17 + lVar18]);
                puVar24[uVar17] = uVar14 + uVar12;
                uVar12 = paethPredictor((ushort)bVar2,(ushort)bVar3,(ushort)bVar4);
                puVar24[uVar17 + 1] = uVar12 + uVar13;
              }
            }
          }
        }
        else {
          for (lVar25 = 0; uVar22 + lVar25 + 3 < uVar27; lVar25 = lVar25 + 4) {
            bVar2 = puVar24[lVar25 + 1];
            bVar3 = puVar24[lVar25 + 2];
            bVar4 = puVar24[lVar25 + 3];
            bVar5 = puVar26[lVar25 + uVar22 + 1];
            bVar6 = puVar26[lVar25 + uVar22 + 2];
            bVar7 = puVar26[lVar25 + uVar22 + 3];
            bVar8 = puVar26[lVar25 + 1];
            bVar9 = puVar26[lVar25 + 2];
            bVar10 = puVar26[lVar25 + 3];
            uVar12 = paethPredictor((ushort)puVar24[lVar25],(ushort)puVar26[lVar25 + uVar22],
                                    (ushort)puVar26[lVar25]);
            uVar13 = paethPredictor((ushort)bVar2,(ushort)bVar5,(ushort)bVar8);
            uVar14 = paethPredictor((ushort)bVar3,(ushort)bVar6,(ushort)bVar9);
            uVar15 = paethPredictor((ushort)bVar4,(ushort)bVar7,(ushort)bVar10);
            uVar11 = *(undefined4 *)(puVar20 + lVar25);
            *(uint *)(puVar23 + lVar25) =
                 CONCAT13(uVar15 + (char)((uint)uVar11 >> 0x18),
                          CONCAT12(uVar14 + (char)((uint)uVar11 >> 0x10),
                                   CONCAT11(uVar13 + (char)((uint)uVar11 >> 8),uVar12 + (char)uVar11
                                           )));
          }
          uVar17 = lVar25 + uVar22;
        }
        for (; uVar27 != uVar17; uVar17 = uVar17 + 1) {
          uVar12 = puVar21[uVar17];
          uVar13 = paethPredictor((ushort)*(byte *)(local_90 + uVar17),(ushort)puVar26[uVar17],
                                  (ushort)puVar26[uVar17 + lVar18]);
          puVar24[uVar17] = uVar13 + uVar12;
        }
      }
      break;
    default:
      return 0x24;
    }
    puVar26 = out + uVar19 * uVar27;
    puVar24 = puVar24 + uVar27;
    puVar21 = puVar21 + lVar1;
    local_78 = local_78 + lVar1;
    local_90 = local_90 + uVar27;
    local_70 = local_70 + lVar1;
    puVar23 = puVar23 + uVar27;
    puVar20 = puVar20 + lVar1;
  }
  return 0;
}

Assistant:

static unsigned unfilter(unsigned char* out, const unsigned char* in, unsigned w, unsigned h, unsigned bpp) {
  /*
  For PNG filter method 0
  this function unfilters a single image (e.g. without interlacing this is called once, with Adam7 seven times)
  out must have enough bytes allocated already, in must have the scanlines + 1 filtertype byte per scanline
  w and h are image dimensions or dimensions of reduced image, bpp is bits per pixel
  in and out are allowed to be the same memory address (but aren't the same size since in has the extra filter bytes)
  */

  unsigned y;
  unsigned char* prevline = 0;

  /*bytewidth is used for filtering, is 1 when bpp < 8, number of bytes per pixel otherwise*/
  size_t bytewidth = (bpp + 7u) / 8u;
  size_t linebytes = (w * bpp + 7u) / 8u;

  for(y = 0; y < h; ++y) {
    size_t outindex = linebytes * y;
    size_t inindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
    unsigned char filterType = in[inindex];

    CERROR_TRY_RETURN(unfilterScanline(&out[outindex], &in[inindex + 1], prevline, bytewidth, filterType, linebytes));

    prevline = &out[outindex];
  }

  return 0;
}